

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChBezierCurve::calcClosestPoint
          (ChVector<double> *__return_storage_ptr__,ChBezierCurve *this,ChVector<double> *loc,
          size_t i,double *t)

{
  bool bVar1;
  int iVar2;
  int j;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar10 [64];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 local_a8 [16];
  double local_98;
  ChVector<double> v;
  undefined8 uStack_60;
  undefined1 extraout_var [56];
  
  iVar2 = -1;
  auVar5 = ZEXT816(0x7fefffffffffffff);
  dVar11 = 0.0;
  for (iVar3 = 0; auVar12._0_8_ = auVar5._0_8_, iVar3 != 0x15; iVar3 = iVar3 + 1) {
    eval((ChVector<double> *)local_a8,this,i,dVar11 * 0.05);
    v.m_data._0_16_ = vsubpd_avx(local_a8,*(undefined1 (*) [16])loc->m_data);
    v.m_data[2] = local_98 - loc->m_data[2];
    auVar10._0_8_ = ChVector<double>::Length2(&v);
    auVar10._8_56_ = extraout_var;
    auVar12._8_8_ = 0;
    auVar5 = vminsd_avx(auVar10._0_16_,auVar12);
    dVar11 = dVar11 + 1.0;
    if (auVar10._0_8_ < auVar12._0_8_) {
      iVar2 = iVar3;
    }
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (double)(iVar2 + -1) * 0.05;
  auVar5 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (double)(iVar2 + 1) * 0.05;
  auVar4 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar9);
  while( true ) {
    dVar11 = auVar5._0_8_;
    dVar13 = auVar4._0_8_;
    if (dVar13 - dVar11 <= 1e-05) break;
    dVar6 = (dVar11 + dVar13) * 0.5;
    *t = dVar6;
    eval((ChVector<double> *)local_a8,this,i,dVar6 + -1e-05);
    v.m_data._0_16_ = vsubpd_avx(local_a8,*(undefined1 (*) [16])loc->m_data);
    v.m_data[2] = local_98 - loc->m_data[2];
    dVar6 = ChVector<double>::Length2(&v);
    eval((ChVector<double> *)local_a8,this,i,*t + 1e-05);
    v.m_data._0_16_ = vsubpd_avx(local_a8,*(undefined1 (*) [16])loc->m_data);
    v.m_data[2] = local_98 - loc->m_data[2];
    dVar7 = ChVector<double>::Length2(&v);
    uStack_60 = auVar4._8_8_;
    bVar1 = dVar6 < dVar7;
    auVar4._0_8_ = (ulong)bVar1 * (long)*t + (ulong)!bVar1 * (long)dVar13;
    auVar4._8_8_ = uStack_60;
    auVar5._0_8_ = (ulong)bVar1 * (long)dVar11 + (ulong)!bVar1 * (long)*t;
    auVar5._8_8_ = 0;
  }
  eval(__return_storage_ptr__,this,i,*t);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChBezierCurve::calcClosestPoint(const ChVector<>& loc, size_t i, double& t) const {
    // Bracket location of projection
    int m_numEvals = 20;
    double dt = 1.0 / m_numEvals;
    int min_idx = -1;
    double d2_min = std::numeric_limits<double>::max();
    for (int j = 0; j <= m_numEvals; j++) {
        double d2 = (eval(i, j * dt) - loc).Length2();
        if (d2 < d2_min) {
            min_idx = j;
            d2_min = d2;
        }
    }

    // Bisection
    int count = m_numEvals + 1;
    double t0 = std::max((min_idx - 1) * dt, 0.0);
    double t1 = std::min((min_idx + 1) * dt, 1.0);
    while (t1 - t0 > m_paramTol) {
        t = (t0 + t1) / 2;
        double d2_0 = (eval(i, t - m_paramTol) - loc).Length2();
        double d2_1 = (eval(i, t + m_paramTol) - loc).Length2();
        if (d2_0 < d2_1)
            t1 = t;
        else
            t0 = t;
        count += 2;
    }

    ////std::cout << "num. evaluations: " << count << std::endl;

    return eval(i, t);

    /*
    // Newton method
    ChVector<> Q = eval(i, t);
    ChVector<> Qd;
    ChVector<> Qdd;

    size_t j = 0;
    for (j = 0; j < m_maxNumIters; j++) {
        ChVector<> vec = Q - loc;
        double d2 = vec.Length2();

        if (d2 < m_sqrDistTol)
            break;

        Qd = evalD(i, t);

        double dot = Vdot(vec, Qd);
        double cosAngle = dot / (std::sqrt(d2) * Qd.Length());

        if (fabs(cosAngle) < m_cosAngleTol)
            break;

        Qdd = evalDD(i, t);

        double dt = dot / (Vdot(vec, Qdd) + Qd.Length2());

        t -= dt;

        Q = eval(i, t);

        if ((dt * Qd).Length2() < m_sqrDistTol)
            break;
    }

    ////std::cout << "num iterations: " << j << "   max: " << m_maxNumIters << std::endl;

    if (t < m_paramTol || t > 1 - m_paramTol) {
        ChClampValue(t, 0.0, 1.0);
        Q = eval(i, t);
    } else {
        ChVector<> Q_0 = eval(i, 0.0);
        ChVector<> Q_1 = eval(i, 1.0);

        double d2 = (Q - loc).Length2();
        double d2_0 = (Q_0 - loc).Length2();
        double d2_1 = (Q_1 - loc).Length2();

        if (d2_0 < d2) {
            t = 0;
            Q = Q_0;
            d2 = d2_0;
        }
        if (d2_1 < d2) {
            t = 1;
            Q = Q_1;
        }
    }

    return Q;
    */
}